

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O1

void __thiscall
Assimp::SIBImporter::InternReadFile
          (SIBImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  uint32_t posB;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined4 uVar6;
  iterator iVar3;
  _func_int **pp_Var4;
  undefined8 uVar7;
  aiScene *paVar8;
  void *__src;
  pointer pSVar9;
  undefined4 uVar10;
  pointer puVar11;
  pointer puVar12;
  _Alloc_hider _Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  int iVar15;
  uint uVar16;
  ai_uint32 aVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined4 extraout_var;
  aiMaterial *this_00;
  aiMesh *paVar21;
  aiLight *paVar22;
  SIBChunk SVar23;
  SIBEdge *pSVar24;
  aiMatrix4x4t<float> *paVar25;
  Logger *this_01;
  ulong *puVar26;
  aiFace *paVar27;
  aiVector3D *paVar28;
  long lVar29;
  aiMaterial **__dest;
  aiMesh **ppaVar30;
  aiLight **ppaVar31;
  aiNode *this_02;
  aiNode **ppaVar32;
  aiNode *paVar33;
  uint *puVar34;
  aiMetadata *paVar35;
  aiString *paVar36;
  aiMetadataEntry *__s;
  undefined1 *puVar37;
  aiNode *paVar38;
  runtime_error *prVar39;
  aiLightSourceType aVar40;
  aiFace *paVar41;
  uint32_t uVar42;
  uint32_t uVar43;
  ulong uVar44;
  uint uVar45;
  size_type sVar47;
  ulong uVar48;
  long lVar49;
  uint32_t *puVar50;
  ulong uVar51;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var52;
  ulong uVar53;
  size_t __n;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  uint32_t prevFaceIdx;
  StreamReaderLE stream;
  float shiny;
  SIB sib;
  aiMaterial *defmtl;
  aiColor3D emis;
  aiColor3D ambi;
  aiVector3D uv;
  aiColor3D spec;
  aiColor3D diff;
  aiString name;
  aiString tex;
  aiString defname;
  ulong local_1028;
  aiVector3t<float> local_1008;
  float local_ffc;
  StreamReader<false,_false> local_ff8;
  aiVector3t<float> local_fc0;
  float local_fb0;
  float local_fac;
  ulong local_fa8;
  ulong local_fa0;
  ulong local_f98;
  ulong local_f90;
  undefined1 local_f88 [16];
  pointer local_f70;
  ulong local_f68;
  ulong local_f60;
  float local_f54;
  aiScene *local_f50;
  void *local_f48;
  iterator iStack_f40;
  aiMaterial **local_f38;
  void *pvStack_f30;
  iterator local_f28;
  aiMesh **ppaStack_f20;
  aiLight **local_f18;
  iterator iStack_f10;
  aiLight **local_f08;
  vector<SIBObject,_std::allocator<SIBObject>_> vStack_f00;
  vector<SIBObject,_std::allocator<SIBObject>_> local_ee8;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  aiMaterial *local_eb0;
  undefined1 local_ea8 [8];
  undefined1 local_ea0 [28];
  float local_e84;
  float local_e80;
  float local_e7c;
  float local_e78;
  float local_e74;
  float local_e70;
  uint local_e6c;
  undefined1 local_e68 [12];
  float fStack_e5c;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  aiVector3t<float> local_e28;
  float *local_e18;
  float *local_e10;
  float *local_e08;
  aiMatrix4x4 *local_e00;
  undefined1 local_df8 [12];
  float fStack_dec;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  undefined1 local_db0 [24];
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  float local_d88;
  float local_d84;
  float fStack_d80;
  float fStack_d7c;
  float fStack_d78;
  float local_d74;
  uint32_t local_d70;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d68;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d50;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_cf0;
  pointer local_cd8;
  pointer local_cd0;
  _Rb_tree_node_base local_cb8;
  size_t local_c98;
  undefined1 local_c90 [5];
  undefined1 auStack_c8b [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c80 [63];
  aiMatrix4x4 local_88c;
  size_t local_848;
  size_t local_840;
  undefined1 local_838 [1028];
  aiString local_434;
  SIBChunk *pSVar46;
  
  _local_c90 = (pointer)local_c80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"rb","");
  iVar15 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,_local_c90);
  StreamReader<false,_false>::StreamReader
            (&local_ff8,(IOStream *)CONCAT44(extraout_var,iVar15),false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_c90 != local_c80) {
    operator_delete(_local_c90,local_c80[0]._M_allocated_capacity + 1);
  }
  if (((int)local_ff8.end - (int)local_ff8.current & 0xfffffff0U) == 0) {
    prVar39 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c90,
                   "SIB file is either empty or corrupt: ",pFile);
    std::runtime_error::runtime_error(prVar39,(string *)local_c90);
    *(undefined ***)prVar39 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar39,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f08 = (aiLight **)0x0;
  vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f18 = (aiLight **)0x0;
  iStack_f10._M_current = (aiLight **)0x0;
  local_f28._M_current = (aiMesh **)0x0;
  ppaStack_f20 = (aiMesh **)0x0;
  local_f38 = (aiMaterial **)0x0;
  pvStack_f30 = (void *)0x0;
  local_f48 = (void *)0x0;
  iStack_f40._M_current = (aiMaterial **)0x0;
  local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  local_eb0 = this_00;
  _local_c90 = (pointer)local_c80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"DefaultMaterial","");
  _Var13._M_p = _local_c90;
  __n = 0x3ff;
  if (((ulong)local_c88._M_pi & 0xfffffc00) == 0) {
    __n = (ulong)local_c88._M_pi & 0xffffffff;
  }
  local_434.length = (ai_uint32)__n;
  memcpy(local_434.data,_local_c90,__n);
  local_434.data[__n] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var13._M_p != local_c80) {
    operator_delete(_Var13._M_p,local_c80[0]._M_allocated_capacity + 1);
  }
  aiMaterial::AddProperty(local_eb0,&local_434,"?mat.name",0,0);
  if (iStack_f40._M_current == local_f38) {
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_f48,iStack_f40,&local_eb0);
  }
  else {
    *iStack_f40._M_current = local_eb0;
    iStack_f40._M_current = iStack_f40._M_current + 1;
  }
  local_f50 = pScene;
  if (((int)local_ff8.limit - (int)local_ff8.current & 0xfffffff8U) != 0) {
    local_e00 = &local_88c;
    local_e08 = &local_88c.a2;
    local_e10 = &local_88c.b3;
    local_e18 = &local_88c.c4;
    do {
      local_ea8 = (undefined1  [8])ReadChunk(&local_ff8);
      uVar45 = ((int)local_ff8.current - (int)local_ff8.buffer) + local_ea8._4_4_;
      pSVar46 = (SIBChunk *)(ulong)uVar45;
      local_e6c = StreamReader<false,_false>::SetReadLimit(&local_ff8,uVar45);
      if ((int)local_ea8._0_4_ < 0x4c474854) {
        if (local_ea8._0_4_ != 0x47525053) {
          if (local_ea8._0_4_ == 0x48454144) {
            uVar45 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
            if (uVar45 - 3 < 0xfffffffe) {
              prVar39 = (runtime_error *)__cxa_allocate_exception(0x10);
              _local_c90 = (pointer)local_c80;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c90,"SIB: Unsupported file version.","");
              std::runtime_error::runtime_error(prVar39,(string *)local_c90);
              *(undefined ***)prVar39 = &PTR__runtime_error_007fa260;
              __cxa_throw(prVar39,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            if (local_ea8._0_4_ != 0x494e5354) goto LAB_005f8a2b;
            _local_c90 = _local_c90 & 0xffffff0000000000;
            memset(local_c90 + 5,0x1b,0x3ff);
            local_88c.a1 = 1.0;
            local_e08[0] = 0.0;
            local_e08[1] = 0.0;
            *(undefined8 *)(local_e08 + 2) = 0;
            local_88c.b2 = 1.0;
            local_e10[0] = 0.0;
            local_e10[1] = 0.0;
            *(undefined8 *)(local_e10 + 2) = 0;
            local_88c.c3 = 1.0;
            local_e18[0] = 0.0;
            local_e18[1] = 0.0;
            *(undefined8 *)(local_e18 + 2) = 0;
            local_88c.d4 = 1.0;
            if (((int)local_ff8.limit - (int)local_ff8.current & 0xfffffff8U) == 0) {
              uVar44 = 0;
            }
            else {
              uVar44 = 0;
              do {
                SVar23 = ReadChunk(&local_ff8);
                local_db0._0_4_ = SVar23.Tag;
                local_db0._4_4_ = SVar23.Size;
                uVar10 = local_db0._4_4_;
                uVar45 = ((int)local_ff8.current - (int)local_ff8.buffer) + local_db0._4_4_;
                pSVar46 = (SIBChunk *)(ulong)uVar45;
                uVar45 = StreamReader<false,_false>::SetReadLimit(&local_ff8,uVar45);
                if ((int)local_db0._0_4_ < 0x50494e46) {
                  if ((float)local_db0._0_4_ == 13.517901) {
                    ReadAxis(local_e00,&local_ff8);
                  }
                  else if ((float)local_db0._0_4_ != 805.223) {
                    if ((float)local_db0._0_4_ == 845108.56) {
                      uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                      uVar44 = (ulong)uVar16;
                    }
                    else {
LAB_005f8332:
                      UnknownChunk((StreamReaderLE *)local_db0,pSVar46);
                    }
                  }
                }
                else if ((float)local_db0._0_4_ != 1.3509401e+10) {
                  if ((float)local_db0._0_4_ == 8.8188335e+11) {
                    local_f54 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    fVar55 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_f88._0_4_ = fVar55;
                    fVar55 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_ec8 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_ffc = StreamReader<false,_false>::Get<float>(&local_ff8);
                    fVar56 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_f60 = CONCAT44(local_f60._4_4_,fVar56);
                    fVar56 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_f90 = CONCAT44(local_f90._4_4_,fVar56);
                    fVar56 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_f98 = CONCAT44(local_f98._4_4_,fVar56);
                    fVar56 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_f68 = CONCAT44(local_f68._4_4_,fVar56);
                    fVar56 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_f70 = (pointer)CONCAT44(local_f70._4_4_,fVar56);
                    fVar56 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_fa0 = CONCAT44(local_fa0._4_4_,fVar56);
                    fVar56 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_fa8 = CONCAT44(local_fa8._4_4_,fVar56);
                    local_fac = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_fb0 = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_ea0._24_4_ = StreamReader<false,_false>::Get<float>(&local_ff8);
                    local_e70 = fVar55 * local_88c.a4 +
                                (float)local_f88._0_4_ * local_88c.a3 +
                                local_f54 * local_88c.a1 + fVar54 * local_88c.a2;
                    local_e74 = (float)local_f90 * local_88c.a4 +
                                (float)local_f60 * local_88c.a3 +
                                local_ec8 * local_88c.a1 + local_ffc * local_88c.a2;
                    local_e78 = (float)local_fa0 * local_88c.a4 +
                                local_f70._0_4_ * local_88c.a3 +
                                (float)local_f98 * local_88c.a1 + (float)local_f68 * local_88c.a2;
                    local_e7c = local_88c.a4 * (float)local_ea0._24_4_ +
                                local_88c.a3 * local_fb0 +
                                local_88c.a1 * (float)local_fa8 + local_88c.a2 * local_fac;
                    local_e80 = fVar55 * local_88c.b4 +
                                (float)local_f88._0_4_ * local_88c.b3 +
                                local_f54 * local_88c.b1 + fVar54 * local_88c.b2;
                    local_e84 = (float)local_f90 * local_88c.b4 +
                                (float)local_f60 * local_88c.b3 +
                                local_ec8 * local_88c.b1 + local_ffc * local_88c.b2;
                    fVar56 = (float)local_f68 * local_88c.b2;
                    fVar64 = (float)local_f98 * local_88c.b1;
                    fVar65 = (float)local_fa0 * local_88c.b4;
                    local_88c.b4 = local_88c.b4 * (float)local_ea0._24_4_ +
                                   local_88c.b3 * local_fb0 +
                                   local_88c.b1 * (float)local_fa8 + local_88c.b2 * local_fac;
                    fVar66 = fVar55 * local_88c.c4;
                    fVar59 = local_ec8 * local_88c.c1;
                    fVar67 = (float)local_f90 * local_88c.c4;
                    fVar57 = (float)local_f68 * local_88c.c2;
                    fVar68 = (float)local_f98 * local_88c.c1;
                    fVar69 = (float)local_fa0 * local_88c.c4;
                    local_88c.c4 = local_88c.c4 * (float)local_ea0._24_4_ +
                                   local_88c.c3 * local_fb0 +
                                   local_88c.c1 * (float)local_fa8 + local_88c.c2 * local_fac;
                    fVar55 = fVar55 * local_88c.d4;
                    fVar61 = local_ec8 * local_88c.d1;
                    fVar62 = (float)local_f90 * local_88c.d4;
                    fVar63 = (float)local_f68 * local_88c.d2;
                    fVar60 = (float)local_f98 * local_88c.d1;
                    fVar58 = (float)local_fa0 * local_88c.d4;
                    local_88c.d4 = (float)local_ea0._24_4_ * local_88c.d4 +
                                   local_fb0 * local_88c.d3 +
                                   (float)local_fa8 * local_88c.d1 + local_fac * local_88c.d2;
                    local_88c.a1 = local_e70;
                    local_88c.a2 = local_e74;
                    local_88c.a3 = local_e78;
                    local_88c.a4 = local_e7c;
                    local_88c.b1 = local_e80;
                    local_88c.b2 = local_e84;
                    local_88c.b3 = fVar65 + local_f70._0_4_ * local_88c.b3 + fVar64 + fVar56;
                    local_88c.c1 = fVar66 + (float)local_f88._0_4_ * local_88c.c3 +
                                            local_f54 * local_88c.c1 + fVar54 * local_88c.c2;
                    local_88c.c2 = fVar67 + (float)local_f60 * local_88c.c3 +
                                            fVar59 + local_ffc * local_88c.c2;
                    local_88c.c3 = fVar69 + local_f70._0_4_ * local_88c.c3 + fVar68 + fVar57;
                    local_88c.d1 = fVar55 + (float)local_f88._0_4_ * local_88c.d3 +
                                            local_f54 * local_88c.d1 + fVar54 * local_88c.d2;
                    local_88c.d2 = fVar62 + (float)local_f60 * local_88c.d3 +
                                            fVar61 + local_ffc * local_88c.d2;
                    local_88c.d3 = fVar58 + local_f70._0_4_ * local_88c.d3 + fVar60 + fVar63;
                  }
                  else {
                    if ((float)local_db0._0_4_ != 8.858588e+11) goto LAB_005f8332;
                    ReadString((aiString *)local_838,&local_ff8,(uint)uVar10 >> 1);
                    uVar51 = local_838._0_8_ & 0xffffffff;
                    local_c90._0_4_ = local_838._0_4_;
                    memcpy(local_c90 + 4,local_838 + 4,uVar51);
                    local_c90[uVar51 + 4] = 0;
                  }
                }
                StreamReader<false,_false>::SetPtr
                          (&local_ff8,
                           (int8_t *)
                           ((ulong)(uint)((int)local_ff8.limit - (int)local_ff8.buffer) +
                           CONCAT44(local_ff8.buffer._4_4_,(int)local_ff8.buffer)));
                StreamReader<false,_false>::SetReadLimit(&local_ff8,uVar45);
              } while (((int)local_ff8.limit - (int)local_ff8.current & 0xfffffff8U) != 0);
            }
            uVar51 = ((long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x3aef6ca970586723;
            if (uVar51 < uVar44 || uVar51 - uVar44 == 0) {
              prVar39 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_838._0_8_ = local_838 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_838,"SIB: Invalid shape index.","");
              std::runtime_error::runtime_error(prVar39,(string *)local_838);
              *(undefined ***)prVar39 = &PTR__runtime_error_007fa260;
              __cxa_throw(prVar39,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            local_848 = vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar44].meshIdx;
            local_840 = vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar44].meshCount;
            std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                      (&local_ee8,(value_type *)local_c90);
          }
        }
      }
      else if ((int)local_ea8._0_4_ < 0x53484150) {
        if (local_ea8._0_4_ == 0x4c474854) {
          paVar22 = (aiLight *)operator_new(0x46c);
          (paVar22->mName).length = 0;
          (paVar22->mName).data[0] = '\0';
          memset((paVar22->mName).data + 1,0x1b,0x3ff);
          paVar22->mType = aiLightSource_UNDEFINED;
          (paVar22->mPosition).x = 0.0;
          (paVar22->mPosition).y = 0.0;
          (paVar22->mPosition).z = 0.0;
          (paVar22->mDirection).x = 0.0;
          (paVar22->mDirection).y = 0.0;
          *(undefined8 *)&(paVar22->mDirection).z = 0;
          (paVar22->mUp).x = 0.0;
          (paVar22->mUp).y = 0.0;
          *(undefined8 *)&(paVar22->mUp).z = 0;
          paVar22->mAttenuationLinear = 1.0;
          paVar22->mAttenuationQuadratic = 0.0;
          (paVar22->mColorDiffuse).r = 0.0;
          (paVar22->mColorDiffuse).g = 0.0;
          (paVar22->mColorDiffuse).b = 0.0;
          (paVar22->mColorSpecular).r = 0.0;
          (paVar22->mColorSpecular).g = 0.0;
          *(undefined8 *)&(paVar22->mColorSpecular).b = 0;
          (paVar22->mColorAmbient).g = 0.0;
          (paVar22->mColorAmbient).b = 0.0;
          paVar22->mAngleInnerCone = 6.2831855;
          paVar22->mAngleOuterCone = 6.2831855;
          (paVar22->mSize).x = 0.0;
          (paVar22->mSize).y = 0.0;
          local_838._0_8_ = paVar22;
          while (((int)local_ff8.limit - (int)local_ff8.current & 0xfffffff8U) != 0) {
            SVar23 = ReadChunk(&local_ff8);
            local_db0._0_4_ = SVar23.Tag;
            local_db0._4_4_ = SVar23.Size;
            uVar10 = local_db0._4_4_;
            uVar45 = ((int)local_ff8.current - (int)local_ff8.buffer) + local_db0._4_4_;
            pSVar46 = (SIBChunk *)(ulong)uVar45;
            uVar45 = StreamReader<false,_false>::SetReadLimit(&local_ff8,uVar45);
            uVar7 = local_838._0_8_;
            if ((float)local_db0._0_4_ == 8.858588e+11) {
              ReadString((aiString *)local_c90,&local_ff8,(uint)uVar10 >> 1);
              uVar7 = local_838._0_8_;
              uVar44 = (ulong)_local_c90 & 0xffffffff;
              ((aiString *)local_838._0_8_)->length = local_c90._0_4_;
              memcpy(((aiString *)local_838._0_8_)->data,local_c90 + 4,uVar44);
              ((aiString *)uVar7)->data[uVar44] = '\0';
            }
            else if ((float)local_db0._0_4_ == 5.407366e+07) {
              uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
              aVar40 = aiLightSource_UNDEFINED;
              if (uVar16 < 3) {
                aVar40 = *(aiLightSourceType *)(&DAT_006e43a0 + (ulong)uVar16 * 4);
              }
              *(aiLightSourceType *)(uVar7 + 0x404) = aVar40;
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
              ((aiVector3D *)(uVar7 + 0x408))->x = fVar54;
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
              ((aiVector3D *)(uVar7 + 0x408))->y = fVar54;
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
              ((aiVector3D *)(uVar7 + 0x408))->z = fVar54;
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
              ((aiVector3D *)(uVar7 + 0x414))->x = fVar54;
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
              ((aiVector3D *)(uVar7 + 0x414))->y = fVar54;
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
              ((aiVector3D *)(uVar7 + 0x414))->z = fVar54;
              ReadColor((StreamReaderLE *)local_c90);
              ((aiColor3D *)(uVar7 + 0x438))->r = (ai_real)local_c90._0_4_;
              ((aiColor3D *)(uVar7 + 0x438))->g = stack0xfffffffffffff374;
              ((aiColor3D *)(uVar7 + 0x438))->b = local_c88._M_pi._0_4_;
              ReadColor((StreamReaderLE *)local_c90);
              ((aiColor3D *)(uVar7 + 0x450))->r = (ai_real)local_c90._0_4_;
              ((aiColor3D *)(uVar7 + 0x450))->g = stack0xfffffffffffff374;
              ((aiColor3D *)(uVar7 + 0x450))->b = local_c88._M_pi._0_4_;
              ReadColor((StreamReaderLE *)local_c90);
              ((aiColor3D *)(uVar7 + 0x444))->r = (ai_real)local_c90._0_4_;
              ((aiColor3D *)(uVar7 + 0x444))->g = stack0xfffffffffffff374;
              ((aiColor3D *)(uVar7 + 0x444))->b = local_c88._M_pi._0_4_;
              fVar55 = StreamReader<false,_false>::Get<float>(&local_ff8);
              fVar56 = StreamReader<false,_false>::Get<float>(&local_ff8);
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
              *(float *)(uVar7 + 0x42c) = fVar54;
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
              *(float *)(uVar7 + 0x430) = fVar54;
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
              *(float *)(uVar7 + 0x434) = fVar54;
              fVar54 = 1e-05;
              if (1e-05 <= fVar55) {
                fVar54 = fVar55;
              }
              local_f88._0_4_ = 1.0 / fVar54;
              fVar54 = powf(0.99,1.0 / fVar54);
              fVar55 = acosf(fVar54);
              fVar54 = powf(0.01,(float)local_f88._0_4_);
              fVar57 = acosf(fVar54);
              fVar54 = fVar56 * 0.017453292;
              if (fVar57 <= fVar56 * 0.017453292) {
                fVar54 = fVar57;
              }
              fVar56 = fVar54;
              if (fVar55 <= fVar54) {
                fVar56 = fVar55;
              }
              *(float *)(uVar7 + 0x45c) = fVar56;
              *(float *)(uVar7 + 0x460) = fVar54;
            }
            else {
              UnknownChunk((StreamReaderLE *)local_db0,pSVar46);
            }
            StreamReader<false,_false>::SetPtr
                      (&local_ff8,
                       (int8_t *)
                       ((ulong)(uint)((int)local_ff8.limit - (int)local_ff8.buffer) +
                       CONCAT44(local_ff8.buffer._4_4_,(int)local_ff8.buffer)));
            StreamReader<false,_false>::SetReadLimit(&local_ff8,uVar45);
          }
          if (iStack_f10._M_current == local_f08) {
            std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                      ((vector<aiLight*,std::allocator<aiLight*>> *)&local_f18,iStack_f10,
                       (aiLight **)local_838);
          }
          else {
            *iStack_f10._M_current = (aiLight *)local_838._0_8_;
            iStack_f10._M_current = iStack_f10._M_current + 1;
          }
        }
        else if (local_ea8._0_4_ == 0x4d415452) {
          ReadColor((StreamReaderLE *)local_db0);
          ReadColor((StreamReaderLE *)local_e68);
          ReadColor((StreamReaderLE *)local_df8);
          ReadColor((StreamReaderLE *)local_ea0);
          uVar45 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
          local_fc0.x = (float)uVar45;
          uVar45 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
          ReadString((aiString *)local_c90,&local_ff8,uVar45 >> 1);
          uVar45 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
          ReadString((aiString *)local_838,&local_ff8,uVar45 >> 1);
          paVar21 = (aiMesh *)operator_new(0x10);
          aiMaterial::aiMaterial((aiMaterial *)paVar21);
          local_1008._0_8_ = paVar21;
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar21,local_db0,0xc,"$clr.diffuse",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)local_1008._0_8_,local_e68,0xc,"$clr.ambient",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)local_1008._0_8_,local_df8,0xc,"$clr.specular",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)local_1008._0_8_,local_ea0,0xc,"$clr.emissive",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)local_1008._0_8_,&local_fc0,4,"$mat.shininess",0,0,aiPTI_Float);
          aiMaterial::AddProperty
                    ((aiMaterial *)local_1008._0_8_,(aiString *)local_c90,"?mat.name",0,0);
          if (local_838._0_4_ != 0) {
            aiMaterial::AddProperty
                      ((aiMaterial *)local_1008._0_8_,(aiString *)local_838,"$tex.file",1,0);
            aiMaterial::AddProperty
                      ((aiMaterial *)local_1008._0_8_,(aiString *)local_838,"$tex.file",3,0);
          }
          if (iStack_f40._M_current == local_f38) {
            std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
            _M_realloc_insert<aiMaterial*const&>
                      ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_f48,iStack_f40,
                       (aiMaterial **)&local_1008);
          }
          else {
            *iStack_f40._M_current = (aiMaterial *)local_1008._0_8_;
            iStack_f40._M_current = iStack_f40._M_current + 1;
          }
        }
        else {
LAB_005f8a2b:
          UnknownChunk((StreamReaderLE *)local_ea8,pSVar46);
        }
      }
      else if (local_ea8._0_4_ == 0x53484150) {
        local_db0._0_4_ = 1.0;
        local_db0._4_4_ = 0.0;
        local_db0._8_4_ = 0.0;
        local_db0._12_4_ = 0.0;
        local_db0._16_4_ = 0.0;
        local_db0._20_4_ = 1.0;
        uStack_d98 = (int8_t *)0x0;
        uStack_d90 = (int8_t *)0x0;
        local_d88 = 1.0;
        local_d84 = 0.0;
        fStack_d80 = 0.0;
        fStack_d7c = 0.0;
        fStack_d78 = 0.0;
        local_d74 = 1.0;
        local_cb8._M_color = _S_red;
        local_cb8._M_parent = (_Base_ptr)0x0;
        memset(&local_d68,0,0xa8);
        local_cb8._M_left = &local_cb8;
        local_c98 = 0;
        local_1028._0_4_ = 0.0;
        local_838._0_8_ = local_838._0_8_ & 0xffffff0000000000;
        local_cb8._M_right = local_cb8._M_left;
        memset(local_838 + 5,0x1b,0x3ff);
        if (((int)local_ff8.limit - (int)local_ff8.current & 0xfffffff8U) != 0) {
          local_1028 = 0;
          do {
            local_e68._0_8_ = ReadChunk(&local_ff8);
            uVar10 = local_e68._4_4_;
            uVar45 = ((int)local_ff8.current - (int)local_ff8.buffer) + local_e68._4_4_;
            pSVar46 = (SIBChunk *)(ulong)uVar45;
            uVar45 = StreamReader<false,_false>::SetReadLimit(&local_ff8,uVar45);
            aVar17 = (ai_uint32)local_1028;
            if ((int)local_e68._0_4_ < 0x46545653) {
              if ((int)local_e68._0_4_ < 0x46414353) {
                if ((int)local_e68._0_4_ < 0x45435253) {
                  if ((float)local_e68._0_4_ == 13.517901) {
                    ReadAxis((aiMatrix4x4 *)local_db0,&local_ff8);
                  }
                  else if ((float)local_e68._0_4_ != 805.223) goto LAB_005f93d8;
                }
                else if ((float)local_e68._0_4_ == 3125.1453) {
                  while ((int)local_ff8.limit != (int)local_ff8.current) {
                    uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                    uVar44 = (ulong)uVar16;
                    uVar51 = ((long)local_cd0 - (long)local_cd8 >> 2) * -0x5555555555555555;
                    if (uVar51 < uVar44 || uVar51 - uVar44 == 0) {
                      local_838._0_4_ = aVar17;
                      prVar39 = (runtime_error *)__cxa_allocate_exception(0x10);
                      _local_c90 = (pointer)local_c80;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_c90,"SIB: Invalid edge index.","");
                      std::runtime_error::runtime_error(prVar39,(string *)local_c90);
                      *(undefined ***)prVar39 = &PTR__runtime_error_007fa260;
                      __cxa_throw(prVar39,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_cd8[uVar44].creased = true;
                  }
                }
                else {
                  if ((float)local_e68._0_4_ != 3140.4578) goto LAB_005f93d8;
                  while ((int)local_ff8.limit != (int)local_ff8.current) {
                    uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                    uVar18 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                    GetEdge((SIBMesh *)local_db0,uVar16,uVar18);
                  }
                }
              }
              else if ((int)local_e68._0_4_ < 0x46414d41) {
                if ((float)local_e68._0_4_ == 12368.831) {
                  if ((int)local_ff8.limit == (int)local_ff8.current) {
                    sVar47 = 0;
                  }
                  else {
                    sVar47 = 0;
                    do {
                      uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                      lVar49 = (long)local_d20.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_d20.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      lVar29 = lVar49 >> 2;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                                (&local_d20,lVar29 + (ulong)(uVar16 * 3) + 1);
                      puVar11 = local_d20.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      *(uint *)((long)local_d20.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar49) = uVar16;
                      local_c90._0_4_ = (float)lVar29;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      emplace_back<unsigned_int>(&local_d08,(uint *)local_c90);
                      _local_c90 = (pointer)((ulong)(uint)stack0xfffffffffffff374 << 0x20);
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      emplace_back<unsigned_int>(&local_cf0,(uint *)local_c90);
                      if (uVar16 != 0) {
                        puVar34 = puVar11 + lVar29 + 1;
                        do {
                          uVar18 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                          uVar44 = ((long)local_d68.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d68.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                   -0x5555555555555555;
                          if (uVar44 < uVar18 || uVar44 - uVar18 == 0) {
                            local_838._0_4_ = aVar17;
                            prVar39 = (runtime_error *)__cxa_allocate_exception(0x10);
                            _local_c90 = (pointer)local_c80;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_c90,"Vertex index is out of range.","");
                            std::runtime_error::runtime_error(prVar39,(string *)local_c90);
                            *(undefined ***)prVar39 = &PTR__runtime_error_007fa260;
                            __cxa_throw(prVar39,&DeadlyImportError::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          *puVar34 = uVar18;
                          uVar18 = (uint)sVar47;
                          puVar34[1] = uVar18;
                          puVar34[2] = uVar18;
                          puVar34 = puVar34 + 3;
                          sVar47 = (size_type)(uVar18 + 1);
                          uVar16 = uVar16 - 1;
                        } while (uVar16 != 0);
                      }
                    } while ((int)local_ff8.limit != (int)local_ff8.current);
                  }
                  _local_c90 = (pointer)0x0;
                  local_c88._M_pi = local_c88._M_pi & 0xffffffff00000000;
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                            (&local_d50,sVar47,(value_type *)local_c90);
                  _local_c90 = (pointer)0x0;
                  local_c88._M_pi = local_c88._M_pi & 0xffffffff00000000;
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                            (&local_d38,sVar47,(value_type *)local_c90);
                  local_d70 = (uint32_t)sVar47;
                }
                else if ((float)local_e68._0_4_ != 12370.081) goto LAB_005f93d8;
              }
              else if ((float)local_e68._0_4_ == 12371.313) {
                uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                uVar19 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                uVar19 = uVar19 + 1;
                uVar18 = uVar16;
                if ((int)local_ff8.limit != (int)local_ff8.current) {
                  do {
                    uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                    uVar20 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                    if (uVar18 < uVar16) {
                      uVar44 = (ulong)uVar18;
                      do {
                        if ((ulong)((long)local_cf0.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_cf0.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar44)
                        {
                          local_838._0_4_ = aVar17;
                          prVar39 = (runtime_error *)__cxa_allocate_exception(0x10);
                          _local_c90 = (pointer)local_c80;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_c90,"Invalid face index.","");
                          std::runtime_error::runtime_error(prVar39,(string *)local_c90);
                          *(undefined ***)prVar39 = &PTR__runtime_error_007fa260;
                          __cxa_throw(prVar39,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar44] = uVar19;
                        uVar44 = uVar44 + 1;
                      } while (uVar16 != uVar44);
                    }
                    uVar19 = uVar20 + 1;
                    uVar18 = uVar16;
                  } while ((int)local_ff8.limit != (int)local_ff8.current);
                }
                uVar44 = (ulong)uVar16;
                if (uVar44 < (ulong)((long)local_cf0.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_cf0.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 2)) {
                  do {
                    uVar16 = uVar16 + 1;
                    local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar44] = uVar19;
                    uVar44 = (ulong)uVar16;
                  } while (uVar44 < (ulong)((long)local_cf0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_cf0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2));
                }
              }
              else if ((float)local_e68._0_4_ != 13138.33) goto LAB_005f93d8;
            }
            else if ((int)local_e68._0_4_ < 0x534e414d) {
              if ((int)local_e68._0_4_ < 0x4d495250) {
                if ((float)local_e68._0_4_ == 13589.581) {
                  while ((int)local_ff8.limit != (int)local_ff8.current) {
                    uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                    uVar18 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff8);
                    if ((ulong)((long)local_d08.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_d08.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) <=
                        (ulong)uVar16) {
                      local_838._0_4_ = aVar17;
                      prVar39 = (runtime_error *)__cxa_allocate_exception(0x10);
                      _local_c90 = (pointer)local_c80;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_c90,"Invalid face index.","");
                      std::runtime_error::runtime_error(prVar39,(string *)local_c90);
                      *(undefined ***)prVar39 = &PTR__runtime_error_007fa260;
                      __cxa_throw(prVar39,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    if (uVar18 != 0) {
                      puVar34 = local_d20.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                                (ulong)(local_d08.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar16] + 1) + 2;
                      do {
                        uVar16 = *puVar34;
                        fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
                        local_d38.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16].x = fVar54;
                        fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
                        local_d38.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16].y = fVar54;
                        puVar34 = puVar34 + 3;
                        uVar18 = uVar18 - 1;
                      } while (uVar18 != 0);
                    }
                  }
                }
                else if ((float)local_e68._0_4_ != 840997.0) goto LAB_005f93d8;
              }
              else if (((float)local_e68._0_4_ != 2.1110093e+08) &&
                      ((float)local_e68._0_4_ != 1.3509401e+10)) {
LAB_005f93d8:
                UnknownChunk((StreamReaderLE *)local_e68,pSVar46);
              }
            }
            else if ((int)local_e68._0_4_ < 0x564d4952) {
              if ((float)local_e68._0_4_ == 8.858588e+11) {
                ReadString((aiString *)local_c90,&local_ff8,(uint)uVar10 >> 1);
                local_1028 = (ulong)_local_c90 & 0xffffffff;
                memcpy(local_838 + 4,local_c90 + 4,local_1028);
                local_838[local_1028 + 4] = 0;
              }
              else if ((float)local_e68._0_4_ != 3.716442e+12) goto LAB_005f93d8;
            }
            else if ((float)local_e68._0_4_ != 5.64287e+13) {
              if ((float)local_e68._0_4_ != 5.7814903e+13) goto LAB_005f93d8;
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                        (&local_d68,(ulong)(uint)uVar10 / 0xc);
              if (0xb < (uint)uVar10) {
                lVar29 = 0;
                do {
                  fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
                  *(float *)((long)&(local_d68.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->x + lVar29) =
                       fVar54;
                  fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
                  *(float *)((long)&(local_d68.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->y + lVar29) =
                       fVar54;
                  fVar54 = StreamReader<false,_false>::Get<float>(&local_ff8);
                  *(float *)((long)&(local_d68.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->z + lVar29) =
                       fVar54;
                  lVar29 = lVar29 + 0xc;
                } while ((ulong)((uint)uVar10 / 0xc << 2) * 3 != lVar29);
              }
            }
            StreamReader<false,_false>::SetPtr
                      (&local_ff8,
                       (int8_t *)
                       ((ulong)(uint)((int)local_ff8.limit - (int)local_ff8.buffer) +
                       CONCAT44(local_ff8.buffer._4_4_,(int)local_ff8.buffer)));
            StreamReader<false,_false>::SetReadLimit(&local_ff8,uVar45);
          } while (((int)local_ff8.limit - (int)local_ff8.current & 0xfffffff8U) != 0);
        }
        local_838._0_4_ = (float)local_1028;
        if ((long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
            (long)local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
          __assert_fail("smesh.faceStart.size() == smesh.mtls.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SIB/SIBImporter.cpp"
                        ,0x238,"void ReadShape(SIB *, StreamReaderLE *)");
        }
        if (local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar29 = (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          lVar49 = 0;
          do {
            uVar44 = (ulong)local_d08.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar49];
            uVar45 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar44];
            if (uVar45 != 0) {
              puVar50 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar44 + 1;
              uVar42 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [uVar44 + (ulong)(uVar45 * 3 - 3) + 1];
              do {
                uVar43 = *puVar50;
                pSVar24 = GetEdge((SIBMesh *)local_db0,uVar42,uVar43);
                if (pSVar24->faceA == 0xffffffff) {
LAB_005f9533:
                  pSVar24->faceA = (uint32_t)lVar49;
                }
                else if (pSVar24->faceB == 0xffffffff) {
                  pSVar24 = (SIBEdge *)&pSVar24->faceB;
                  goto LAB_005f9533;
                }
                puVar50 = puVar50 + 3;
                uVar45 = uVar45 - 1;
                uVar42 = uVar43;
              } while (uVar45 != 0);
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 != lVar29 + (ulong)(lVar29 == 0));
        }
        puVar12 = local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        puVar11 = local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar47 = (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_c90,
                   sVar47,(allocator_type *)local_e68);
        if (puVar12 != puVar11) {
          local_fa8 = sVar47 + (sVar47 == 0);
          uVar44 = 0;
          do {
            uVar51 = (ulong)local_d08.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar44];
            uVar53 = (ulong)local_d20.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar51];
            if (uVar53 == 0) {
              fVar55 = 0.0;
              fVar56 = 0.0;
              fVar54 = 0.0;
            }
            else {
              puVar34 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                        uVar51 + (uVar53 * 3 - 3 & 0xffffffff) + 1;
              fVar54 = 0.0;
              uVar48 = 0;
              fVar56 = 0.0;
              fVar55 = 0.0;
              do {
                uVar45 = *puVar34;
                puVar34 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          uVar51 + (uVar48 & 0xffffffff) + 1;
                uVar16 = *puVar34;
                fVar55 = fVar55 + (local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar45].y *
                                   local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar16].z -
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].y *
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar45].z);
                fVar56 = fVar56 + (local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar45].z *
                                   local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar16].x -
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].z *
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar45].x);
                fVar54 = fVar54 + (local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar45].x *
                                   local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar16].y -
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].x *
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar45].y);
                uVar48 = uVar48 + 3;
              } while (uVar53 * 3 != uVar48);
            }
            *(float *)(_local_c90 + uVar44 * 0xc) = fVar55;
            *(float *)(_local_c90 + uVar44 * 0xc + 4) = fVar56;
            *(float *)(_local_c90 + uVar44 * 0xc + 8) = fVar54;
            uVar44 = uVar44 + 1;
          } while (uVar44 != local_fa8);
          uVar44 = 0;
          do {
            local_f68 = (ulong)local_d20.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [local_d08.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar44]];
            if (local_f68 != 0) {
              local_f70 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          (ulong)local_d08.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar44] + 1;
              uVar51 = 0;
              local_fa0 = uVar44;
              do {
                uVar42 = local_f70[(uint)((int)uVar51 * 3)];
                local_f98 = (ulong)local_f70[(int)uVar51 * 3 + 1];
                uVar44 = 0;
                uVar53 = local_fa0 & 0xffffffff;
                local_f90 = uVar51;
                do {
                  fVar54 = 0.0;
                  local_f88._0_4_ = 0.0;
                  local_ec8 = 0.0;
                  local_ffc = (float)uVar53;
                  local_1028 = uVar53;
                  local_f60 = uVar44;
                  while( true ) {
                    fVar55 = (float)uVar53;
                    local_f88 = ZEXT416((uint)(*(float *)(_local_c90 + uVar53 * 0xc) +
                                              (float)local_f88._0_4_));
                    fVar54 = fVar54 + *(float *)(_local_c90 + uVar53 * 0xc + 8);
                    uVar44 = (ulong)local_d08.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar53];
                    uVar45 = local_d20.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar44];
                    fStack_ec4 = local_ec8;
                    fStack_ec0 = local_ec8;
                    fStack_ebc = local_ec8;
                    if (uVar45 == 0) {
                      fVar56 = -NAN;
                      local_ec8 = local_ec8 + *(float *)(_local_c90 + uVar53 * 0xc + 4);
                    }
                    else {
                      puVar50 = local_d20.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar44 + 1;
                      local_ec8 = local_ec8 + *(float *)(_local_c90 + uVar53 * 0xc + 4);
                      uVar43 = local_d20.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [uVar44 + (ulong)(uVar45 * 3 - 3) + 1];
                      fVar57 = -NAN;
                      do {
                        posB = *puVar50;
                        fVar56 = fVar57;
                        if ((uVar43 == uVar42) || (posB == uVar42)) {
                          pSVar24 = GetEdge((SIBMesh *)local_db0,uVar43,posB);
                          fVar58 = (float)pSVar24->faceA;
                          fVar59 = (float)pSVar24->faceB;
                          if ((((fVar58 == fVar55) || (fVar59 == fVar55)) &&
                              (pSVar24->creased == false)) &&
                             (((fVar58 == fVar55 || (fVar58 == (float)local_1028)) ||
                              (fVar56 = fVar58, fVar58 == -NAN)))) {
                            fVar56 = fVar59;
                            if (fVar59 == -NAN) {
                              fVar56 = fVar57;
                            }
                            if (fVar59 == (float)local_1028) {
                              fVar56 = fVar57;
                            }
                            if (fVar59 == fVar55) {
                              fVar56 = fVar57;
                            }
                          }
                        }
                        puVar50 = puVar50 + 3;
                        uVar45 = uVar45 - 1;
                        uVar43 = posB;
                        fVar57 = fVar56;
                      } while (uVar45 != 0);
                    }
                    fVar58 = local_ec8;
                    fVar57 = (float)local_f88._0_4_;
                    if (fVar56 != local_ffc && fVar56 != -NAN) {
                      local_1028._0_4_ = fVar55;
                    }
                    local_1028 = (ulong)(uint)(float)local_1028;
                    if (fVar56 == local_ffc || fVar56 == -NAN) break;
                    uVar53 = (ulong)(uint)fVar56;
                  }
                  uVar44 = (ulong)((int)local_f60 + 1);
                } while ((int)local_f60 == 0);
                fVar55 = fVar54 * fVar54 +
                         (float)local_f88._0_4_ * (float)local_f88._0_4_ + local_ec8 * local_ec8;
                if (fVar55 < 0.0) {
                  fVar55 = sqrtf(fVar55);
                }
                else {
                  fVar55 = SQRT(fVar55);
                }
                if (1e-09 < fVar55) {
                  fVar55 = 1.0 / fVar55;
                  fVar57 = (float)local_f88._0_4_ * fVar55;
                  fVar58 = local_ec8 * fVar55;
                  fVar54 = fVar54 * fVar55;
                }
                local_d50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_f98].x = fVar57;
                local_d50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_f98].y = fVar58;
                local_d50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_f98].z = fVar54;
                uVar51 = local_f90 + 1;
                uVar44 = local_fa0;
              } while (uVar51 != local_f68);
            }
            uVar44 = uVar44 + 1;
          } while (uVar44 != local_fa8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_c90 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(_local_c90,local_c80[0]._M_allocated_capacity - (long)_local_c90);
        }
        local_e68._4_4_ = local_db0._4_4_;
        local_e68._0_4_ = local_db0._0_4_;
        unique0x10002309 =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(local_db0._12_4_,local_db0._8_4_);
        local_e58 = (int8_t *)CONCAT44(local_db0._20_4_,local_db0._16_4_);
        uStack_e40 = (int8_t *)CONCAT44(local_d84,local_d88);
        fStack_e34 = fStack_d7c;
        local_e38 = fStack_d80;
        fStack_e2c = local_d74;
        fStack_e30 = fStack_d78;
        local_e48 = uStack_d90;
        uStack_e50 = uStack_d98;
        aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_e68);
        local_dd8 = local_e48;
        local_de8 = local_e58;
        local_df8._0_8_ = local_e68._0_8_;
        local_dc8 = local_e38;
        fStack_dc4 = fStack_e34;
        fStack_dc0 = fStack_e30;
        fStack_dbc = fStack_e2c;
        uStack_dd0 = (int8_t *)((ulong)uStack_e40 & 0xffffffff);
        uStack_de0 = (int8_t *)((ulong)uStack_e50 & 0xffffffff);
        stack0xfffffffffffff210 = stack0xfffffffffffff1a0 & 0xffffffff;
        paVar25 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_df8);
        fVar54 = paVar25->b1;
        paVar25->b1 = paVar25->a2;
        paVar25->a2 = fVar54;
        fVar54 = paVar25->c1;
        paVar25->c1 = paVar25->a3;
        paVar25->a3 = fVar54;
        fVar54 = paVar25->c2;
        paVar25->c2 = paVar25->b3;
        paVar25->b3 = fVar54;
        fVar54 = paVar25->d1;
        paVar25->d1 = paVar25->a4;
        paVar25->a4 = fVar54;
        fVar54 = paVar25->d2;
        paVar25->d2 = paVar25->b4;
        paVar25->b4 = fVar54;
        fVar54 = paVar25->d3;
        paVar25->d3 = paVar25->c4;
        paVar25->c4 = fVar54;
        std::vector<TempMesh,_std::allocator<TempMesh>_>::vector
                  ((vector<TempMesh,_std::allocator<TempMesh>_> *)local_ea0,
                   (long)iStack_f40._M_current - (long)local_f48 >> 3,(allocator_type *)local_c90);
        if (local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar44 = 0;
          do {
            puVar34 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar44];
            uVar53 = (ulong)local_cf0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar44];
            uVar51 = ((long)(local_ea0._8_8_ - local_ea0._0_8_) >> 5) * -0x5555555555555555;
            if (uVar51 < uVar53 || uVar51 - uVar53 == 0) {
              this_01 = DefaultLogger::get();
              uVar53 = 0;
              Logger::error(this_01,"SIB: Face material index is invalid.");
            }
            p_Var52 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_ea0._0_8_ + uVar53 * 6 * 0x10);
            local_c88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            uVar45 = *puVar34;
            _local_c90 = (pointer)CONCAT44((int)((ulong)_local_c90 >> 0x20),uVar45);
            local_c88._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__((ulong)uVar45 << 2);
            if (uVar45 != 0) {
              puVar34 = puVar34 + 1;
              uVar51 = 0;
              do {
                *(int *)((long)&(local_c88._M_pi)->_vptr__Sp_counted_base + uVar51 * 4) =
                     (int)((ulong)(*(long *)&p_Var52->_M_use_count -
                                  (long)p_Var52->_vptr__Sp_counted_base) >> 2) * -0x55555555;
                uVar1 = local_d68.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar34].x;
                uVar5 = local_d68.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar34].y;
                fVar54 = local_d68.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[*puVar34].z;
                uVar2 = local_d50.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[puVar34[1]].x;
                uVar6 = local_d50.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[puVar34[1]].y;
                fVar55 = local_d50.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[puVar34[1]].z;
                local_e28.x = local_d38.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar34[2]].x;
                local_e28.y = local_d38.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar34[2]].y;
                local_e28.z = local_d38.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar34[2]].z;
                local_1008.z = fVar54 * (float)uStack_e40 +
                               (float)uVar1 * (float)local_e48 + (float)uVar5 * local_e48._4_4_ +
                               uStack_e40._4_4_;
                local_1008._0_8_ =
                     CONCAT44((float)uStack_e50 * fVar54 +
                              (float)local_e58 * (float)uVar1 + local_e58._4_4_ * (float)uVar5 +
                              uStack_e50._4_4_,
                              (float)local_e68._8_4_ * fVar54 +
                              (float)local_e68._0_4_ * (float)uVar1 +
                              (float)local_e68._4_4_ * (float)uVar5 + fStack_e5c);
                local_fc0.z = fVar55 * (float)uStack_dd0 +
                              (float)uVar2 * (float)local_dd8 + (float)uVar6 * local_dd8._4_4_ +
                              uStack_dd0._4_4_;
                local_fc0.y = (float)uStack_de0 * fVar55 +
                              (float)local_de8 * (float)uVar2 + local_de8._4_4_ * (float)uVar6 +
                              uStack_de0._4_4_;
                local_fc0.x = (float)local_df8._8_4_ * fVar55 +
                              (float)local_df8._0_4_ * (float)uVar2 +
                              (float)local_df8._4_4_ * (float)uVar6 + fStack_dec;
                iVar3._M_current = *(aiVector3t<float> **)&p_Var52->_M_use_count;
                if (iVar3._M_current == (aiVector3t<float> *)p_Var52[1]._vptr__Sp_counted_base) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)p_Var52,
                             iVar3,&local_1008);
                }
                else {
                  (iVar3._M_current)->z = local_1008.z;
                  *(undefined8 *)iVar3._M_current = local_1008._0_8_;
                  *(long *)&p_Var52->_M_use_count = *(long *)&p_Var52->_M_use_count + 0xc;
                }
                iVar3._M_current = (aiVector3t<float> *)p_Var52[2]._vptr__Sp_counted_base;
                if (iVar3._M_current == *(aiVector3t<float> **)&p_Var52[2]._M_use_count) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                             &p_Var52[1]._M_use_count,iVar3,&local_fc0);
                }
                else {
                  (iVar3._M_current)->z = local_fc0.z;
                  (iVar3._M_current)->x = local_fc0.x;
                  (iVar3._M_current)->y = local_fc0.y;
                  p_Var52[2]._vptr__Sp_counted_base =
                       (_func_int **)((long)p_Var52[2]._vptr__Sp_counted_base + 0xc);
                }
                iVar3._M_current = *(aiVector3t<float> **)&p_Var52[3]._M_use_count;
                if (iVar3._M_current == (aiVector3t<float> *)p_Var52[4]._vptr__Sp_counted_base) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                             (p_Var52 + 3),iVar3,&local_e28);
                }
                else {
                  (iVar3._M_current)->z = local_e28.z;
                  (iVar3._M_current)->x = local_e28.x;
                  (iVar3._M_current)->y = local_e28.y;
                  *(long *)&p_Var52[3]._M_use_count = *(long *)&p_Var52[3]._M_use_count + 0xc;
                }
                uVar51 = uVar51 + 1;
                puVar34 = puVar34 + 3;
              } while (uVar51 < ((ulong)_local_c90 & 0xffffffff));
            }
            std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                      ((vector<aiFace,_std::allocator<aiFace>_> *)&p_Var52[4]._M_use_count,
                       (value_type *)local_c90);
            if (local_c88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              operator_delete__(local_c88._M_pi);
            }
            uVar44 = (ulong)((int)uVar44 + 1);
          } while (uVar44 < (ulong)((long)local_d08.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d08.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2));
        }
        _local_c90 = _local_c90 & 0xffffff0000000000;
        memset(local_c90 + 5,0x1b,0x3ff);
        local_88c.a1 = 1.0;
        local_e08[0] = 0.0;
        local_e08[1] = 0.0;
        *(undefined8 *)(local_e08 + 2) = 0;
        local_88c.b2 = 1.0;
        local_e10[0] = 0.0;
        local_e10[1] = 0.0;
        *(undefined8 *)(local_e10 + 2) = 0;
        local_88c.c3 = 1.0;
        local_e18[0] = 0.0;
        local_e18[1] = 0.0;
        *(undefined8 *)(local_e18 + 2) = 0;
        local_88c.d4 = 1.0;
        uVar44 = local_838._0_8_ & 0xffffffff;
        local_c90._0_4_ = local_838._0_4_;
        memcpy(local_c90 + 4,local_838 + 4,uVar44);
        local_f88._0_8_ = uVar44;
        local_c90[uVar44 + 4] = 0;
        local_e00->d1 = fStack_d80;
        local_e00->d2 = fStack_d7c;
        local_e00->d3 = fStack_d78;
        local_e00->d4 = local_d74;
        local_e00->c1 = (float)uStack_d90;
        local_e00->c2 = uStack_d90._4_4_;
        local_e00->c3 = local_d88;
        local_e00->c4 = local_d84;
        local_e00->b1 = (float)local_db0._16_4_;
        local_e00->b2 = (float)local_db0._20_4_;
        local_e00->b3 = (float)uStack_d98;
        local_e00->b4 = uStack_d98._4_4_;
        local_e00->a1 = (float)local_db0._0_4_;
        local_e00->a2 = (float)local_db0._4_4_;
        local_e00->a3 = (float)local_db0._8_4_;
        local_e00->a4 = (float)local_db0._12_4_;
        local_848 = (long)local_f28._M_current - (long)pvStack_f30 >> 3;
        if (local_ea0._8_8_ != local_ea0._0_8_) {
          uVar44 = 0;
          do {
            uVar7 = local_ea0._0_8_;
            if (*(_func_int ***)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (local_ea0._0_8_ + (uVar44 * 6 + 4) * 0x10))->_M_use_count !=
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (local_ea0._0_8_ + (uVar44 * 6 + 5) * 0x10))->_vptr__Sp_counted_base) {
              paVar21 = (aiMesh *)operator_new(0x520);
              p_Var52 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar7 + uVar44 * 6 * 0x10);
              paVar21->mPrimitiveTypes = 0;
              paVar21->mNumVertices = 0;
              paVar21->mNumFaces = 0;
              memset(&paVar21->mVertices,0,0xcc);
              paVar21->mBones = (aiBone **)0x0;
              paVar21->mMaterialIndex = 0;
              (paVar21->mName).length = 0;
              (paVar21->mName).data[0] = '\0';
              memset((paVar21->mName).data + 1,0x1b,0x3ff);
              paVar21->mNumAnimMeshes = 0;
              paVar21->mAnimMeshes = (aiAnimMesh **)0x0;
              paVar21->mMethod = 0;
              (paVar21->mAABB).mMin.x = 0.0;
              (paVar21->mAABB).mMin.y = 0.0;
              (paVar21->mAABB).mMin.z = 0.0;
              (paVar21->mAABB).mMax.x = 0.0;
              (paVar21->mAABB).mMax.y = 0.0;
              (paVar21->mAABB).mMax.z = 0.0;
              memset(paVar21->mColors,0,0xa0);
              uVar7 = local_f88._0_8_;
              (paVar21->mName).length = local_f88._0_4_;
              local_1008._0_8_ = paVar21;
              memcpy((paVar21->mName).data,local_838 + 4,local_f88._0_8_);
              (paVar21->mName).data[uVar7] = '\0';
              uVar51 = (long)p_Var52[5]._vptr__Sp_counted_base - *(long *)&p_Var52[4]._M_use_count
                       >> 4;
              paVar21->mNumFaces = (uint)uVar51;
              uVar51 = uVar51 & 0xffffffff;
              puVar26 = (ulong *)operator_new__(uVar51 * 0x10 + 8);
              *puVar26 = uVar51;
              paVar27 = (aiFace *)(puVar26 + 1);
              if (uVar51 != 0) {
                paVar41 = paVar27;
                do {
                  paVar41->mNumIndices = 0;
                  paVar41->mIndices = (uint *)0x0;
                  paVar41 = paVar41 + 1;
                } while (paVar41 != paVar27 + uVar51);
              }
              paVar21->mFaces = paVar27;
              lVar49 = *(long *)&p_Var52->_M_use_count - (long)p_Var52->_vptr__Sp_counted_base;
              lVar29 = lVar49 >> 0x3f;
              uVar51 = (lVar49 / 6 + lVar29 >> 1) - lVar29;
              uVar45 = (uint)uVar51;
              paVar21->mNumVertices = uVar45;
              uVar51 = (uVar51 & 0xffffffff) * 0xc;
              paVar28 = (aiVector3D *)operator_new__(uVar51);
              if (uVar45 != 0) {
                memset(paVar28,0,((uVar51 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar21->mVertices = paVar28;
              paVar28 = (aiVector3D *)operator_new__(uVar51);
              if (uVar45 != 0) {
                memset(paVar28,0,((uVar51 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar21->mNormals = paVar28;
              uVar45 = paVar21->mNumVertices;
              uVar51 = (ulong)uVar45 * 0xc;
              paVar28 = (aiVector3D *)operator_new__(uVar51);
              if (uVar45 == 0) {
                paVar21->mTextureCoords[0] = paVar28;
                paVar21->mNumUVComponents[0] = 2;
                paVar21->mMaterialIndex = (uint)uVar44;
              }
              else {
                memset(paVar28,0,((uVar51 - 0xc) / 0xc) * 0xc + 0xc);
                paVar21->mTextureCoords[0] = paVar28;
                paVar21->mNumUVComponents[0] = 2;
                paVar21->mMaterialIndex = (uint)uVar44;
                lVar29 = 0;
                uVar51 = 0;
                do {
                  pp_Var4 = p_Var52->_vptr__Sp_counted_base;
                  paVar28 = paVar21->mVertices;
                  *(undefined4 *)((long)&paVar28->z + lVar29) =
                       *(undefined4 *)((long)pp_Var4 + lVar29 + 8);
                  *(undefined8 *)((long)&paVar28->x + lVar29) =
                       *(undefined8 *)((long)pp_Var4 + lVar29);
                  lVar49 = *(long *)&p_Var52[1]._M_use_count;
                  paVar28 = paVar21->mNormals;
                  *(undefined4 *)((long)&paVar28->z + lVar29) = *(undefined4 *)(lVar49 + lVar29 + 8)
                  ;
                  *(undefined8 *)((long)&paVar28->x + lVar29) = *(undefined8 *)(lVar49 + lVar29);
                  pp_Var4 = p_Var52[3]._vptr__Sp_counted_base;
                  paVar28 = paVar21->mTextureCoords[0];
                  *(undefined4 *)((long)&paVar28->z + lVar29) =
                       *(undefined4 *)((long)pp_Var4 + lVar29 + 8);
                  *(undefined8 *)((long)&paVar28->x + lVar29) =
                       *(undefined8 *)((long)pp_Var4 + lVar29);
                  uVar51 = uVar51 + 1;
                  lVar29 = lVar29 + 0xc;
                } while (uVar51 < paVar21->mNumVertices);
              }
              if (paVar21->mNumFaces != 0) {
                lVar29 = 0;
                uVar51 = 0;
                do {
                  aiFace::operator=((aiFace *)((long)&paVar21->mFaces->mNumIndices + lVar29),
                                    (aiFace *)(*(long *)&p_Var52[4]._M_use_count + lVar29));
                  uVar51 = uVar51 + 1;
                  lVar29 = lVar29 + 0x10;
                  paVar21 = (aiMesh *)local_1008._0_8_;
                } while (uVar51 < *(uint *)(local_1008._0_8_ + 8));
              }
              if (local_f28._M_current == ppaStack_f20) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&pvStack_f30,local_f28,
                           (aiMesh **)&local_1008);
              }
              else {
                *local_f28._M_current = paVar21;
                local_f28._M_current = local_f28._M_current + 1;
              }
            }
            uVar44 = uVar44 + 1;
          } while (uVar44 < (ulong)(((long)(local_ea0._8_8_ - local_ea0._0_8_) >> 5) *
                                   -0x5555555555555555));
        }
        local_840 = ((long)local_f28._M_current - (long)pvStack_f30 >> 3) - local_848;
        std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                  (&vStack_f00,(value_type *)local_c90);
        std::vector<TempMesh,_std::allocator<TempMesh>_>::~vector
                  ((vector<TempMesh,_std::allocator<TempMesh>_> *)local_ea0);
        SIBMesh::~SIBMesh((SIBMesh *)local_db0);
        pScene = local_f50;
      }
      else if (local_ea8._0_4_ != 0x54455850) goto LAB_005f8a2b;
      StreamReader<false,_false>::SetPtr
                (&local_ff8,
                 (int8_t *)
                 ((ulong)(uint)((int)local_ff8.limit - (int)local_ff8.buffer) +
                 CONCAT44(local_ff8.buffer._4_4_,(int)local_ff8.buffer)));
      StreamReader<false,_false>::SetReadLimit(&local_ff8,local_e6c);
    } while (((int)local_ff8.limit - (int)local_ff8.current & 0xfffffff8U) != 0);
  }
  lVar29 = (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                 super__Vector_impl_data._M_start;
  std::vector<SIBObject,std::allocator<SIBObject>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<SIBObject*,std::vector<SIBObject,std::allocator<SIBObject>>>>
            ((vector<SIBObject,std::allocator<SIBObject>> *)&vStack_f00,
             vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_finish);
  __src = local_f48;
  if (local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  uVar44 = (long)iStack_f40._M_current - (long)local_f48;
  uVar16 = (uint)(uVar44 >> 3);
  pScene->mNumMaterials = uVar16;
  uVar53 = (long)local_f28._M_current - (long)pvStack_f30;
  uVar18 = (uint)(uVar53 >> 3);
  pScene->mNumMeshes = uVar18;
  uVar51 = (long)iStack_f10._M_current - (long)local_f18;
  uVar45 = (uint)(uVar51 >> 3);
  pScene->mNumLights = uVar45;
  if (uVar16 == 0) {
    __dest = (aiMaterial **)0x0;
  }
  else {
    __dest = (aiMaterial **)operator_new__(uVar44 & 0x7fffffff8);
  }
  local_f50->mMaterials = __dest;
  if (uVar18 == 0) {
    ppaVar30 = (aiMesh **)0x0;
  }
  else {
    ppaVar30 = (aiMesh **)operator_new__(uVar53 & 0x7fffffff8);
  }
  local_f50->mMeshes = ppaVar30;
  if (uVar45 == 0) {
    ppaVar31 = (aiLight **)0x0;
  }
  else {
    ppaVar31 = (aiLight **)operator_new__(uVar51 & 0x7fffffff8);
  }
  paVar8 = local_f50;
  local_f50->mLights = ppaVar31;
  if (uVar16 != 0) {
    memcpy(__dest,__src,uVar44 & 0x7fffffff8);
  }
  if ((ulong)paVar8->mNumMeshes != 0) {
    memcpy(paVar8->mMeshes,pvStack_f30,(ulong)paVar8->mNumMeshes << 3);
  }
  if ((ulong)paVar8->mNumLights != 0) {
    memcpy(paVar8->mLights,local_f18,(ulong)paVar8->mNumLights << 3);
  }
  this_02 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_02);
  (this_02->mName).length = 9;
  builtin_strncpy((this_02->mName).data,"<SIBRoot>",10);
  lVar49 = ((long)iStack_f10._M_current - (long)local_f18 >> 3) +
           ((long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x3aef6ca970586723;
  uVar45 = (uint)lVar49;
  this_02->mNumChildren = uVar45;
  if (uVar45 == 0) {
    ppaVar32 = (aiNode **)0x0;
  }
  else {
    ppaVar32 = (aiNode **)operator_new__(lVar49 * 8 & 0x7fffffff8);
  }
  this_02->mChildren = ppaVar32;
  paVar8->mRootNode = this_02;
  if (vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar44 = 0;
  }
  else {
    uVar44 = 0;
    do {
      pSVar9 = vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (this_02->mChildren == (aiNode **)0x0) {
        __assert_fail("root->mChildren",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SIB/SIBImporter.cpp"
                      ,0x38e,
                      "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      paVar33 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar33);
      paVar38 = (aiNode *)(pSVar9 + uVar44);
      this_02->mChildren[uVar44] = paVar33;
      if (paVar33 != paVar38) {
        uVar45 = (paVar38->mName).length;
        (paVar33->mName).length = uVar45;
        memcpy((paVar33->mName).data,(paVar38->mName).data,(ulong)uVar45);
        (paVar33->mName).data[uVar45] = '\0';
      }
      paVar33->mParent = this_02;
      fVar54 = (paVar38->mTransformation).a2;
      fVar55 = (paVar38->mTransformation).a3;
      fVar56 = (paVar38->mTransformation).a4;
      fVar57 = (paVar38->mTransformation).b1;
      fVar58 = (paVar38->mTransformation).b2;
      fVar59 = (paVar38->mTransformation).b3;
      fVar60 = (paVar38->mTransformation).b4;
      fVar61 = (paVar38->mTransformation).c1;
      fVar62 = (paVar38->mTransformation).c2;
      fVar63 = (paVar38->mTransformation).c3;
      fVar64 = (paVar38->mTransformation).c4;
      fVar65 = (paVar38->mTransformation).d1;
      fVar66 = (paVar38->mTransformation).d2;
      fVar67 = (paVar38->mTransformation).d3;
      fVar68 = (paVar38->mTransformation).d4;
      (paVar33->mTransformation).a1 = (paVar38->mTransformation).a1;
      (paVar33->mTransformation).a2 = fVar54;
      (paVar33->mTransformation).a3 = fVar55;
      (paVar33->mTransformation).a4 = fVar56;
      (paVar33->mTransformation).b1 = fVar57;
      (paVar33->mTransformation).b2 = fVar58;
      (paVar33->mTransformation).b3 = fVar59;
      (paVar33->mTransformation).b4 = fVar60;
      (paVar33->mTransformation).c1 = fVar61;
      (paVar33->mTransformation).c2 = fVar62;
      (paVar33->mTransformation).c3 = fVar63;
      (paVar33->mTransformation).c4 = fVar64;
      (paVar33->mTransformation).d1 = fVar65;
      (paVar33->mTransformation).d2 = fVar66;
      (paVar33->mTransformation).d3 = fVar67;
      (paVar33->mTransformation).d4 = fVar68;
      uVar51 = *(ulong *)&paVar38->mNumChildren;
      uVar45 = (uint)uVar51;
      paVar33->mNumMeshes = uVar45;
      if (uVar45 == 0) {
        puVar34 = (uint *)0x0;
      }
      else {
        puVar34 = (uint *)operator_new__((uVar51 & 0xffffffff) << 2);
      }
      paVar33->mMeshes = puVar34;
      if (paVar33->mNumMeshes != 0) {
        uVar51 = 0;
        do {
          paVar33->mMeshes[uVar51] = *(int *)&paVar38->mParent + (int)uVar51;
          uVar51 = uVar51 + 1;
        } while (uVar51 < paVar33->mNumMeshes);
      }
      if ((ulong)((lVar29 >> 3) * 0x3aef6ca970586723) <= uVar44) {
        paVar35 = (aiMetadata *)operator_new(0x18);
        paVar35->mKeys = (aiString *)0x0;
        paVar35->mValues = (aiMetadataEntry *)0x0;
        paVar35->mNumProperties = 1;
        paVar36 = (aiString *)operator_new__(0x404);
        paVar36->length = 0;
        paVar36->data[0] = '\0';
        memset(paVar36->data + 1,0x1b,0x3ff);
        paVar35->mKeys = paVar36;
        uVar51 = (ulong)paVar35->mNumProperties << 4;
        __s = (aiMetadataEntry *)operator_new__(uVar51);
        memset(__s,0,uVar51);
        paVar35->mValues = __s;
        paVar33->mMetaData = paVar35;
        _local_c90 = (pointer)local_c80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"IsInstance","");
        _Var14._M_pi = local_c88._M_pi;
        if ((paVar35->mNumProperties != 0) &&
           (local_c88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          if (local_c88._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400) {
            paVar36 = paVar35->mKeys;
            paVar36->length = (ai_uint32)local_c88._M_pi;
            memcpy(paVar36->data,_local_c90,(size_t)local_c88._M_pi);
            paVar36->data[(long)_Var14._M_pi] = '\0';
          }
          paVar35->mValues->mType = AI_BOOL;
          puVar37 = (undefined1 *)operator_new(1);
          *puVar37 = 1;
          paVar35->mValues->mData = puVar37;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_c90 != local_c80) {
          operator_delete(_local_c90,local_c80[0]._M_allocated_capacity + 1);
        }
      }
      uVar44 = uVar44 + 1;
    } while (uVar44 < (ulong)(((long)vStack_f00.
                                     super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)vStack_f00.
                                     super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x3aef6ca970586723));
  }
  if (iStack_f10._M_current != local_f18) {
    uVar51 = 0;
    do {
      if (this_02->mChildren == (aiNode **)0x0) {
        __assert_fail("root->mChildren",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SIB/SIBImporter.cpp"
                      ,0x3a7,
                      "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      paVar33 = (aiNode *)local_f18[uVar51];
      if (paVar33 != (aiNode *)0x0) {
        paVar38 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar38);
        this_02->mChildren[uVar44] = paVar38;
        if (paVar38 != paVar33) {
          uVar45 = (paVar33->mName).length;
          (paVar38->mName).length = uVar45;
          memcpy((paVar38->mName).data,(paVar33->mName).data,(ulong)uVar45);
          (paVar38->mName).data[uVar45] = '\0';
        }
        uVar44 = uVar44 + 1;
        paVar38->mParent = this_02;
      }
      uVar51 = uVar51 + 1;
    } while (uVar51 < (ulong)((long)iStack_f10._M_current - (long)local_f18 >> 3));
  }
  if (local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f18 != (aiLight **)0x0) {
    operator_delete(local_f18,(long)local_f08 - (long)local_f18);
  }
  if (pvStack_f30 != (void *)0x0) {
    operator_delete(pvStack_f30,(long)ppaStack_f20 - (long)pvStack_f30);
  }
  if (local_f48 != (void *)0x0) {
    operator_delete(local_f48,(long)local_f38 - (long)local_f48);
  }
  StreamReader<false,_false>::~StreamReader(&local_ff8);
  return;
}

Assistant:

void SIBImporter::InternReadFile(const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile, "rb"));

    // We should have at least one chunk
    if (stream.GetRemainingSize() < 16)
        throw DeadlyImportError("SIB file is either empty or corrupt: " + pFile);

    SIB sib;

    // Default material.
    aiMaterial* defmtl = new aiMaterial;
    aiString defname = aiString(AI_DEFAULT_MATERIAL_NAME);
    defmtl->AddProperty(&defname, AI_MATKEY_NAME);
    sib.mtls.push_back(defmtl);

    // Read it all.
    ReadScene(&sib, &stream);

    // Join the instances and objects together.
    size_t firstInst = sib.objs.size();
    sib.objs.insert(sib.objs.end(), sib.insts.begin(), sib.insts.end());
    sib.insts.clear();

    // Transfer to the aiScene.
    pScene->mNumMaterials = static_cast<unsigned int>(sib.mtls.size());
    pScene->mNumMeshes = static_cast<unsigned int>(sib.meshes.size());
    pScene->mNumLights = static_cast<unsigned int>(sib.lights.size());
    pScene->mMaterials = pScene->mNumMaterials ? new aiMaterial*[pScene->mNumMaterials] : NULL;
    pScene->mMeshes = pScene->mNumMeshes ? new aiMesh*[pScene->mNumMeshes] : NULL;
    pScene->mLights = pScene->mNumLights ? new aiLight*[pScene->mNumLights] : NULL;
    if (pScene->mNumMaterials)
        memcpy(pScene->mMaterials, &sib.mtls[0], sizeof(aiMaterial*) * pScene->mNumMaterials);
    if (pScene->mNumMeshes)
        memcpy(pScene->mMeshes, &sib.meshes[0], sizeof(aiMesh*) * pScene->mNumMeshes);
    if (pScene->mNumLights)
        memcpy(pScene->mLights, &sib.lights[0], sizeof(aiLight*) * pScene->mNumLights);

    // Construct the root node.
    size_t childIdx = 0;
    aiNode *root = new aiNode();
    root->mName.Set("<SIBRoot>");
    root->mNumChildren = static_cast<unsigned int>(sib.objs.size() + sib.lights.size());
    root->mChildren = root->mNumChildren ? new aiNode*[root->mNumChildren] : NULL;
    pScene->mRootNode = root;

    // Add nodes for each object.
    for (size_t n=0;n<sib.objs.size();n++)
    {
        ai_assert(root->mChildren);
        SIBObject& obj = sib.objs[n];
        aiNode* node = new aiNode;
        root->mChildren[childIdx++] = node;
        node->mName = obj.name;
        node->mParent = root;
        node->mTransformation = obj.axis;

        node->mNumMeshes = static_cast<unsigned int>(obj.meshCount);
        node->mMeshes = node->mNumMeshes ? new unsigned[node->mNumMeshes] : NULL;
        for (unsigned i=0;i<node->mNumMeshes;i++)
            node->mMeshes[i] = static_cast<unsigned int>(obj.meshIdx + i);

        // Mark instanced objects as being so.
        if (n >= firstInst)
        {
            node->mMetaData = aiMetadata::Alloc( 1 );
            node->mMetaData->Set( 0, "IsInstance", true );
        }
    }

    // Add nodes for each light.
    // (no transformation as the light is already in world space)
    for (size_t n=0;n<sib.lights.size();n++)
    {
        ai_assert(root->mChildren);
        aiLight* light = sib.lights[n];
        if ( nullptr != light ) {
            aiNode* node = new aiNode;
            root->mChildren[ childIdx++ ] = node;
            node->mName = light->mName;
            node->mParent = root;
        }
    }
}